

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.h
# Opt level: O3

void __thiscall minihttp::Request::Request(Request *this,Request *param_1)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  (this->protocol)._M_dataplus._M_p = (pointer)&(this->protocol).field_2;
  pcVar1 = (param_1->protocol)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->protocol)._M_string_length);
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  pcVar1 = (param_1->host)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host,pcVar1,pcVar1 + (param_1->host)._M_string_length);
  (this->header)._M_dataplus._M_p = (pointer)&(this->header).field_2;
  pcVar1 = (param_1->header)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->header,pcVar1,pcVar1 + (param_1->header)._M_string_length);
  (this->resource)._M_dataplus._M_p = (pointer)&(this->resource).field_2;
  pcVar1 = (param_1->resource)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->resource,pcVar1,pcVar1 + (param_1->resource)._M_string_length);
  (this->extraGetHeaders)._M_dataplus._M_p = (pointer)&(this->extraGetHeaders).field_2;
  pcVar1 = (param_1->extraGetHeaders)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->extraGetHeaders,pcVar1,
             pcVar1 + (param_1->extraGetHeaders)._M_string_length);
  this->useSSL = param_1->useSSL;
  uVar2 = *(undefined4 *)&param_1->field_0xa4;
  uVar3 = *(undefined4 *)&param_1->user;
  uVar4 = *(undefined4 *)((long)&param_1->user + 4);
  this->port = param_1->port;
  *(undefined4 *)&this->field_0xa4 = uVar2;
  *(undefined4 *)&this->user = uVar3;
  *(undefined4 *)((long)&this->user + 4) = uVar4;
  (this->post).data._M_dataplus._M_p = (pointer)&(this->post).data.field_2;
  pcVar1 = (param_1->post).data._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->post,pcVar1,pcVar1 + (param_1->post).data._M_string_length);
  return;
}

Assistant:

Request() : port(80), user(NULL) {}